

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  TPZGeoMesh *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int64_t iVar8;
  TPZFMatrix<std::complex<double>_> *pTVar9;
  pair<TPZCompMesh_*,_long> *ppVar10;
  TPZFMatrix<std::complex<double>_> *pTVar11;
  TPZConnect *pTVar12;
  int64_t iVar13;
  complex<double> *pcVar14;
  TPZCompMesh *pTVar15;
  long lVar16;
  TPZCompEl *pTVar17;
  TPZCompMesh *in_RSI;
  TPZSubCompMesh *sub;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  complex<double> valsub;
  int posfather;
  int idf_1;
  int64_t seqnumsub;
  TPZConnect *consub;
  TPZFMatrix<std::complex<double>_> *solsub;
  TPZBlock *blocksub;
  int nblock;
  int64_t seqnumfather;
  TPZConnect *confather;
  TPZFMatrix<std::complex<double>_> *solfather;
  TPZBlock *blockfather;
  int64_t submeshIndex;
  int64_t fatherconIndex;
  int ic;
  int nconnect_1;
  TPZCompEl *compel;
  TPZFMatrix<std::complex<double>_> *fathermeshSol;
  TPZCompMesh *fathermesh;
  TPZSubCompMesh *msub;
  complex<double> getval;
  int idf;
  int64_t seqnumMF;
  TPZConnect *conMF;
  int blsize;
  int64_t seqnum;
  TPZConnect *con;
  TPZFMatrix<std::complex<double>_> *sol;
  TPZBlock *block;
  TPZCompMesh *atomic_mesh;
  int64_t connect;
  TPZFMatrix<std::complex<double>_> *solMF;
  TPZBlock *blockMF;
  int64_t nconnect;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  TPZCompMesh *in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  TPZSubCompMesh *in_stack_fffffffffffffd80;
  int64_t in_stack_fffffffffffffd88;
  TPZBlock *in_stack_fffffffffffffd90;
  TPZCompMesh *in_stack_fffffffffffffd98;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffda0;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> *in_stack_fffffffffffffda8;
  TPZCompMesh *in_stack_fffffffffffffdb0;
  TPZCompMesh *local_208;
  TPZCompMesh *local_1f0;
  long local_168;
  int local_13c;
  int local_e0;
  int local_a4;
  int64_t local_60;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_30;
  TPZCompMesh *local_10;
  
  local_10 = in_RSI;
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::TPZVec(&local_30);
  ComputeAtomicIndexes(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  iVar8 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::size(&local_30);
  TPZCompMesh::Block(local_10);
  TPZCompMesh::Solution(local_10);
  pTVar9 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                     ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
  for (local_60 = 0; local_60 < iVar8; local_60 = local_60 + 1) {
    ppVar10 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
    pTVar15 = ppVar10->first;
    if (pTVar15 != (TPZCompMesh *)0x0) {
      TPZCompMesh::Block(pTVar15);
      TPZCompMesh::Solution(pTVar15);
      pTVar11 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                          ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(pTVar15);
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
      pTVar12 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd88);
      iVar13 = TPZConnect::SequenceNumber(pTVar12);
      if (iVar13 < 0) {
        pzinternal::DebugStopImpl((char *)confather,seqnumfather);
      }
      iVar5 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
      TPZCompMesh::ConnectVec(local_10);
      pTVar12 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd88);
      iVar13 = TPZConnect::SequenceNumber(pTVar12);
      if (iVar13 < 0) {
        pzinternal::DebugStopImpl((char *)confather,seqnumfather);
      }
      for (local_a4 = 0; local_a4 < iVar5; local_a4 = local_a4 + 1) {
        iVar13 = TPZBlock::Index(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pcVar14 = TPZFMatrix<std::complex<double>_>::operator()(pTVar11,iVar13);
        uVar1 = *(undefined8 *)pcVar14->_M_value;
        uVar2 = *(undefined8 *)(pcVar14->_M_value + 8);
        iVar13 = TPZBlock::Index(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pcVar14 = TPZFMatrix<std::complex<double>_>::operator()(pTVar9,iVar13);
        *(undefined8 *)pcVar14->_M_value = uVar1;
        *(undefined8 *)(pcVar14->_M_value + 8) = uVar2;
      }
    }
  }
  if (local_10 == (TPZCompMesh *)0x0) {
    local_1f0 = (TPZCompMesh *)0x0;
  }
  else {
    local_1f0 = (TPZCompMesh *)
                __dynamic_cast(local_10,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
  }
  if (local_1f0 != (TPZCompMesh *)0x0) {
    pTVar15 = (TPZCompMesh *)(**(code **)(*(long *)local_1f0 + 0x98))();
    TPZCompMesh::Solution(pTVar15);
    pTVar9 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                       ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
    local_208 = (TPZCompMesh *)0x0;
    if (local_1f0 != (TPZCompMesh *)0x0) {
      local_208 = local_1f0 + 1;
    }
    iVar5 = (**(code **)(*(long *)local_208 + 0x90))();
    for (local_e0 = 0; local_e0 < iVar5; local_e0 = local_e0 + 1) {
      lVar16 = (**(code **)(*(long *)local_208 + 0xa0))(local_208,local_e0);
      TPZSubCompMesh::InternalIndex(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if (lVar16 == -1) {
        pzinternal::DebugStopImpl((char *)confather,seqnumfather);
      }
      TPZCompMesh::Block(pTVar15);
      TPZCompMesh::Solution(pTVar15);
      TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(pTVar15);
      pTVar12 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd88);
      iVar8 = TPZConnect::SequenceNumber(pTVar12);
      iVar6 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
      TPZCompMesh::Block(local_1f0);
      TPZCompMesh::Solution(local_1f0);
      pTVar11 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                          ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(local_1f0);
      pTVar12 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd88);
      TPZConnect::SequenceNumber(pTVar12);
      if (iVar8 < 0) {
        pzinternal::DebugStopImpl((char *)confather,seqnumfather);
      }
      for (local_13c = 0; local_13c < iVar6; local_13c = local_13c + 1) {
        iVar7 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
        in_stack_fffffffffffffda0 = pTVar11;
        iVar8 = TPZBlock::Index(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        in_stack_fffffffffffffd98 =
             (TPZCompMesh *)
             TPZFMatrix<std::complex<double>_>::operator()(in_stack_fffffffffffffda0,iVar8);
        pp_Var3 = *(_func_int ***)in_stack_fffffffffffffd98;
        pTVar4 = in_stack_fffffffffffffd98->fReference;
        in_stack_fffffffffffffd90 =
             (TPZBlock *)
             TPZFMatrix<std::complex<double>_>::operator()(pTVar9,(long)(iVar7 + local_13c));
        (in_stack_fffffffffffffd90->super_TPZSavable)._vptr_TPZSavable = pp_Var3;
        (in_stack_fffffffffffffd90->fBlock).super_TPZVec<TPZBlock::TNode>._vptr_TPZVec =
             (_func_int **)pTVar4;
      }
    }
  }
  iVar8 = TPZCompMesh::NElements((TPZCompMesh *)0x1e435a1);
  for (local_168 = 0; local_168 < iVar8; local_168 = local_168 + 1) {
    pTVar17 = TPZCompMesh::Element
                        (in_stack_fffffffffffffd70,
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if (pTVar17 == (TPZCompEl *)0x0) {
      in_stack_fffffffffffffd70 = (TPZCompMesh *)0x0;
    }
    else {
      in_stack_fffffffffffffd70 =
           (TPZCompMesh *)
           __dynamic_cast(pTVar17,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
    }
    if (in_stack_fffffffffffffd70 != (TPZCompMesh *)0x0) {
      TransferFromMeshes((TPZVec<TPZCompMesh_*> *)in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffd98);
    }
  }
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec
            ((TPZVec<std::pair<TPZCompMesh_*,_long>_> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}